

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t cv_action(EditLine *el,wint_t c)

{
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_chared).c_vcmd.action == L'\0') {
    (el->el_chared).c_vcmd.pos = (el->el_line).cursor;
    (el->el_chared).c_vcmd.action = c;
    el_local._7_1_ = '\x03';
  }
  else if (c == (el->el_chared).c_vcmd.action) {
    if ((c & 4) == 0) {
      cv_undo(el);
    }
    cv_yank(el,(el->el_line).buffer,
            (wchar_t)((long)(el->el_line).lastchar - (long)(el->el_line).buffer >> 2));
    (el->el_chared).c_vcmd.action = L'\0';
    (el->el_chared).c_vcmd.pos = (wchar_t *)0x0;
    if ((c & 4) == 0) {
      (el->el_line).lastchar = (el->el_line).buffer;
      (el->el_line).cursor = (el->el_line).buffer;
    }
    if ((c & 2) != 0) {
      (el->el_map).current = (el->el_map).key;
    }
    el_local._7_1_ = '\x04';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

static el_action_t
cv_action(EditLine *el, wint_t c)
{

	if (el->el_chared.c_vcmd.action != NOP) {
		/* 'cc', 'dd' and (possibly) friends */
		if (c != (wint_t)el->el_chared.c_vcmd.action)
			return CC_ERROR;

		if (!(c & YANK))
			cv_undo(el);
		cv_yank(el, el->el_line.buffer,
		    (int)(el->el_line.lastchar - el->el_line.buffer));
		el->el_chared.c_vcmd.action = NOP;
		el->el_chared.c_vcmd.pos = 0;
		if (!(c & YANK)) {
			el->el_line.lastchar = el->el_line.buffer;
			el->el_line.cursor = el->el_line.buffer;
		}
		if (c & INSERT)
			el->el_map.current = el->el_map.key;

		return CC_REFRESH;
	}
	el->el_chared.c_vcmd.pos = el->el_line.cursor;
	el->el_chared.c_vcmd.action = c;
	return CC_ARGHACK;
}